

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

Section QDateTimeEditPrivate::convertToPublic(Section s)

{
  Section SVar1;
  Section s_local;
  Section local_4;
  
  SVar1 = s & ~Internal;
  if (SVar1 == NoSection) {
LAB_00559a79:
    local_4 = NoSection;
  }
  else {
    if (SVar1 == AmPmSection) {
      return AmPmSection;
    }
    if (SVar1 == MSecSection) {
      return MSecSection;
    }
    if (SVar1 == SecondSection) {
      return SecondSection;
    }
    if (SVar1 == MinuteSection) {
      return MinuteSection;
    }
    if ((SVar1 == Hour12Section) || (SVar1 == Hour24Section)) {
      return HourSection;
    }
    if (SVar1 != DaySection) {
      if (SVar1 == MonthSection) {
        return MonthSection;
      }
      if ((SVar1 == YearSection) || (SVar1 == YearSection2Digits)) {
        return YearSection;
      }
      if ((SVar1 != DayOfWeekSectionShort) && (SVar1 != DayOfWeekSectionLong)) goto LAB_00559a79;
    }
    local_4 = DaySection;
  }
  return local_4;
}

Assistant:

QDateTimeEdit::Section QDateTimeEditPrivate::convertToPublic(QDateTimeParser::Section s)
{
    switch (s & ~Internal) {
    case AmPmSection: return QDateTimeEdit::AmPmSection;
    case MSecSection: return QDateTimeEdit::MSecSection;
    case SecondSection: return QDateTimeEdit::SecondSection;
    case MinuteSection: return QDateTimeEdit::MinuteSection;
    case DayOfWeekSectionShort:
    case DayOfWeekSectionLong:
    case DaySection: return QDateTimeEdit::DaySection;
    case MonthSection: return QDateTimeEdit::MonthSection;
    case YearSection2Digits:
    case YearSection: return QDateTimeEdit::YearSection;
    case Hour12Section:
    case Hour24Section: return QDateTimeEdit::HourSection;
    case FirstSection:
    case NoSection:
    case LastSection: break;
    }
    return QDateTimeEdit::NoSection;
}